

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O2

string * joinCommandLine(string *__return_storage_ptr__,
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *args)

{
  pointer pbVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  pointer __lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (__lhs = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start; __lhs != pbVar1; __lhs = __lhs + 1) {
    lVar2 = std::__cxx11::string::find((char)__lhs,0x20);
    if (lVar2 == -1) {
      std::operator+(&local_70,__lhs,' ');
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      this = &local_70;
    }
    else {
      std::operator+(&local_50,"\"",__lhs);
      std::operator+(&local_70,&local_50,"\" ");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_70);
      this = &local_50;
    }
    std::__cxx11::string::~string((string *)this);
  }
  std::__cxx11::string::erase
            ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length - 1);
  return __return_storage_ptr__;
}

Assistant:

static std::string joinCommandLine(const std::vector<std::string>& args)
{
  std::string ret;

  for (std::string const& s : args) {
    if (s.find(' ') == std::string::npos) {
      ret += s + ' ';
    } else {
      ret += "\"" + s + "\" ";
    }
  }

  // drop trailing whitespace
  ret.erase(ret.size() - 1);

  return ret;
}